

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

float __thiscall cnn::Model::gradient_l2_norm(Model *this)

{
  bool bVar1;
  size_type sVar2;
  pointer ppPVar3;
  reference ppPVar4;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *in_RDI;
  double dVar5;
  int i;
  double gg;
  ParametersBase *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  int pi;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
  *in_stack_ffffffffffffffb0;
  int local_3c;
  double local_38;
  __normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
  local_20 [2];
  int local_c;
  
  if (in_RDI[3].super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    in_stack_ffffffffffffffb0 =
         *(__normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
           **)(default_device + 0x10);
    sVar2 = std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::size(in_RDI)
    ;
    ppPVar3 = (pointer)(*(code *)in_stack_ffffffffffffffb0->_M_current[2])
                                 (in_stack_ffffffffffffffb0,sVar2 << 2);
    in_RDI[3].super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppPVar3;
  }
  local_c = 0;
  local_20[0]._M_current =
       (ParametersBase **)
       std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::begin
                 (in_stack_ffffffffffffffa8);
  std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::end
            (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppPVar4 = __gnu_cxx::
              __normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
              ::operator*(local_20);
    (*(*ppPVar4)->_vptr_ParametersBase[2])
              (*ppPVar4,(long)in_RDI[3].
                              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)local_c * 4);
    local_c = local_c + 1;
    __gnu_cxx::
    __normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
    ::operator++(local_20);
  }
  local_38 = 0.0;
  for (local_3c = 0; local_3c < local_c; local_3c = local_3c + 1) {
    local_38 = (double)*(float *)((long)in_RDI[3].
                                        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 (long)local_3c * 4) + local_38;
  }
  dVar5 = sqrt(local_38);
  return (float)dVar5;
}

Assistant:

float Model::gradient_l2_norm() const {
  if (!gradient_norm_scratch)
    gradient_norm_scratch = (float*)default_device->mem->malloc(all_params.size() * sizeof(float));
  int pi = 0;
  for (auto p : all_params) {
    p->g_squared_l2norm(&gradient_norm_scratch[pi]);
    ++pi;
  }
#if HAVE_CUDA
  float res = 0;
  gpu::l2_norm_reducer(all_params.size(), gradient_norm_scratch, gradient_norm_scratch, false, false);
  cudaMemcpy(&res, gradient_norm_scratch, sizeof(float),  cudaMemcpyDeviceToHost);
  return sqrt(res);
#else
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += gradient_norm_scratch[i];
  return sqrt(gg);
#endif
}